

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::
       tuple_caster<std::pair,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>::
       cast_impl<std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>,0ul,1ul>
                 (Matrix<double,_1,_3,_1,_1,_3> *src,undefined8 param_2,handle parent)

{
  undefined8 uVar1;
  handle hVar2;
  long lVar3;
  array<pybind11::object,_2UL> *__range3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  
  hVar2 = type_caster<Eigen::Matrix<double,1,3,1,1,3>,void>::
          cast_impl<Eigen::Matrix<double,1,3,1,1,3>>(src,move,parent);
  entries._M_elems[0].super_handle = hVar2;
  entries._M_elems[1].super_handle =
       type_caster<Eigen::Matrix<double,1,3,1,1,3>,void>::cast_impl<Eigen::Matrix<double,1,3,1,1,3>>
                 (src + 1,move,parent);
  if (entries._M_elems[1].super_handle.m_ptr == (PyObject *)0x0 || hVar2.m_ptr == (PyObject *)0x0) {
    hVar2.m_ptr = (PyObject *)0x0;
  }
  else {
    tuple::tuple(&result,2);
    for (lVar3 = 0; hVar2.m_ptr = (PyObject *)result.super_object.super_handle.m_ptr, lVar3 != 0x10;
        lVar3 = lVar3 + 8) {
      uVar1 = *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3);
      *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3) = 0;
      if ((*(byte *)(*(long *)((long)result.super_object.super_handle.m_ptr + 8) + 0xab) & 4) == 0)
      {
        __assert_fail("PyTuple_Check(result.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                      ,0x588,
                      "static handle pybind11::detail::tuple_caster<std::pair, Eigen::Matrix<double, 1, 3>, Eigen::Matrix<double, 1, 3>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::pair, Ts = <Eigen::Matrix<double, 1, 3>, Eigen::Matrix<double, 1, 3>>, T = std::pair<Eigen::Matrix<double, 1, 3>, Eigen::Matrix<double, 1, 3>>, Is = <0UL, 1UL>]"
                     );
      }
      *(undefined8 *)((long)result.super_object.super_handle.m_ptr + 0x18 + lVar3) = uVar1;
    }
    result.super_object.super_handle.m_ptr = (object)(handle)0x0;
    pybind11::object::~object(&result.super_object);
  }
  std::array<pybind11::object,_2UL>::~array(&entries);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }